

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

void __thiscall ON_PointCloud::ON_PointCloud(ON_PointCloud *this,ON_3dPoint *P0,int count)

{
  double *points;
  int count_local;
  ON_3dPoint *P0_local;
  ON_PointCloud *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b767a8;
  ON_3dPointArray::ON_3dPointArray(&this->m_P,count);
  ON_SimpleArray<ON_3dVector>::ON_SimpleArray(&this->m_N);
  ON_SimpleArray<ON_Color>::ON_SimpleArray(&this->m_C);
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_V);
  ON_SimpleArray<bool>::ON_SimpleArray(&this->m_H);
  this->m_hidden_count = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_flags = 0;
  points = ON_3dPoint::operator_cast_to_double_(P0);
  ON_3dPointArray::Create(&this->m_P,3,0,count,3,points);
  return;
}

Assistant:

ON_PointCloud::ON_PointCloud(const ON_3dPoint* P0, int count) : m_P(count)
{
  m_P.Create(3, false, count, 3, P0[0]);
}